

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O2

bool __thiscall
bssl::NormalizeName(bssl *this,Input name_rdn_sequence,string *normalized_rdn_sequence,
                   CertErrors *errors)

{
  uint tag;
  pointer pXVar1;
  bool bVar2;
  int iVar3;
  uint8_t *__first;
  uint8_t *puVar4;
  size_t sVar5;
  X509NameAttribute *pXVar6;
  Input input;
  RelativeDistinguishedName type_and_values;
  string normalized_value;
  ScopedCBB cbb;
  CBB value_cbb;
  Parser rdn_parser;
  Parser rdn_sequence_parser;
  CBB type_cbb;
  CBB attribute_type_and_value_cbb;
  CBB rdn_cbb;
  
  if (normalized_rdn_sequence == (string *)0x0) {
    abort();
  }
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&rdn_sequence_parser,input);
  CBB_zero(&cbb.ctx_);
  iVar3 = CBB_init(&cbb.ctx_,0);
  if (iVar3 == 0) {
LAB_0038d0d1:
    bVar2 = false;
  }
  else {
    do {
      bVar2 = der::Parser::HasMore(&rdn_sequence_parser);
      if (!bVar2) {
        __first = CBB_data(&cbb.ctx_);
        puVar4 = CBB_data(&cbb.ctx_);
        sVar5 = CBB_len(&cbb.ctx_);
        bVar2 = true;
        ::std::__cxx11::string::assign<unsigned_char_const*,void>
                  ((string *)name_rdn_sequence.data_.size_,__first,puVar4 + sVar5);
        break;
      }
      der::Parser::Parser(&rdn_parser);
      bVar2 = der::Parser::ReadConstructed(&rdn_sequence_parser,0x20000011,&rdn_parser);
      if (!bVar2) goto LAB_0038d0d1;
      type_and_values.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      type_and_values.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      type_and_values.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ReadRdn(&rdn_parser,&type_and_values);
      if (!bVar2) {
LAB_0038d0c7:
        ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
        ~_Vector_base(&type_and_values.
                       super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                     );
        goto LAB_0038d0d1;
      }
      iVar3 = CBB_add_asn1(&cbb.ctx_,&rdn_cbb,0x20000011);
      pXVar1 = type_and_values.
               super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pXVar6 = type_and_values.
               super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (iVar3 == 0) goto LAB_0038d0c7;
        if (pXVar6 == pXVar1) break;
        iVar3 = CBB_add_asn1(&rdn_cbb,&attribute_type_and_value_cbb,0x20000010);
        if (((iVar3 == 0) ||
            (iVar3 = CBB_add_asn1(&attribute_type_and_value_cbb,&type_cbb,6), iVar3 == 0)) ||
           (iVar3 = CBB_add_bytes(&type_cbb,(pXVar6->type).data_.data_,(pXVar6->type).data_.size_),
           iVar3 == 0)) goto LAB_0038d0c7;
        tag = pXVar6->value_tag;
        if ((tag < 0x1f) && ((0x50481000U >> (tag & 0x1f) & 1) != 0)) {
          normalized_value._M_dataplus._M_p = (pointer)&normalized_value.field_2;
          normalized_value._M_string_length = 0;
          normalized_value.field_2._M_local_buf[0] = '\0';
          bVar2 = anon_unknown_1::NormalizeValue
                            (*pXVar6,&normalized_value,(CertErrors *)normalized_rdn_sequence);
          if (((!bVar2) ||
              (iVar3 = CBB_add_asn1(&attribute_type_and_value_cbb,&value_cbb,0xc), iVar3 == 0)) ||
             (iVar3 = CBB_add_bytes(&value_cbb,(uint8_t *)normalized_value._M_dataplus._M_p,
                                    normalized_value._M_string_length), iVar3 == 0)) {
            ::std::__cxx11::string::~string((string *)&normalized_value);
            goto LAB_0038d0c7;
          }
          ::std::__cxx11::string::~string((string *)&normalized_value);
        }
        else {
          iVar3 = CBB_add_asn1(&attribute_type_and_value_cbb,&value_cbb,tag);
          if ((iVar3 == 0) ||
             (iVar3 = CBB_add_bytes(&value_cbb,(pXVar6->value).data_.data_,
                                    (pXVar6->value).data_.size_), iVar3 == 0)) goto LAB_0038d0c7;
        }
        iVar3 = CBB_flush(&rdn_cbb);
        pXVar6 = pXVar6 + 1;
      }
      iVar3 = CBB_flush_asn1_set_of(&rdn_cbb);
      if (iVar3 == 0) goto LAB_0038d0c7;
      iVar3 = CBB_flush(&cbb.ctx_);
      ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
      ~_Vector_base(&type_and_values.
                     super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                   );
      bVar2 = false;
    } while (iVar3 != 0);
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  return bVar2;
}

Assistant:

bool NormalizeName(der::Input name_rdn_sequence,
                   std::string *normalized_rdn_sequence, CertErrors *errors) {
  BSSL_CHECK(errors);

  // RFC 5280 section 4.1.2.4
  // RDNSequence ::= SEQUENCE OF RelativeDistinguishedName
  der::Parser rdn_sequence_parser(name_rdn_sequence);

  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 0)) {
    return false;
  }

  while (rdn_sequence_parser.HasMore()) {
    // RelativeDistinguishedName ::= SET SIZE (1..MAX) OF AttributeTypeAndValue
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    CBB rdn_cbb;
    if (!CBB_add_asn1(cbb.get(), &rdn_cbb, CBS_ASN1_SET)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      // AttributeTypeAndValue ::= SEQUENCE {
      //   type     AttributeType,
      //   value    AttributeValue }
      CBB attribute_type_and_value_cbb, type_cbb, value_cbb;
      if (!CBB_add_asn1(&rdn_cbb, &attribute_type_and_value_cbb,
                        CBS_ASN1_SEQUENCE)) {
        return false;
      }

      // AttributeType ::= OBJECT IDENTIFIER
      if (!CBB_add_asn1(&attribute_type_and_value_cbb, &type_cbb,
                        CBS_ASN1_OBJECT) ||
          !CBB_add_bytes(&type_cbb, type_and_value.type.data(),
                         type_and_value.type.size())) {
        return false;
      }

      // AttributeValue ::= ANY -- DEFINED BY AttributeType
      if (IsNormalizableDirectoryString(type_and_value.value_tag)) {
        std::string normalized_value;
        if (!NormalizeValue(type_and_value, &normalized_value, errors)) {
          return false;
        }
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          CBS_ASN1_UTF8STRING) ||
            !CBB_add_bytes(
                &value_cbb,
                reinterpret_cast<const uint8_t *>(normalized_value.data()),
                normalized_value.size())) {
          return false;
        }
      } else {
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          type_and_value.value_tag) ||
            !CBB_add_bytes(&value_cbb, type_and_value.value.data(),
                           type_and_value.value.size())) {
          return false;
        }
      }

      if (!CBB_flush(&rdn_cbb)) {
        return false;
      }
    }

    // Ensure the encoded AttributeTypeAndValue values in the SET OF are sorted.
    if (!CBB_flush_asn1_set_of(&rdn_cbb) || !CBB_flush(cbb.get())) {
      return false;
    }
  }

  normalized_rdn_sequence->assign(CBB_data(cbb.get()),
                                  CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}